

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O2

void __thiscall IMLE<1,_1,_FastLinearExpert>::EM(IMLE<1,_1,_FastLinearExpert> *this,Z *z,X *x)

{
  X *pXVar1;
  ostream *poVar2;
  pointer pFVar3;
  ActualDstType actualDst;
  pointer pFVar4;
  pointer pFVar5;
  iterator it;
  DstEvaluatorType dstEvaluator_2;
  double dVar6;
  double dVar7;
  double adVar8 [1];
  ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> local_1e8;
  double local_1e0;
  double local_1d8;
  FastLinearExpert<1,_1> local_1d0;
  
  pFVar3 = (this->experts).
           super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
           .
           super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  dVar7 = 0.0;
  pFVar5 = (this->experts).
           super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
           .
           super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (pFVar4 = pFVar5; pFVar4 < pFVar3; pFVar4 = pFVar4 + 1) {
    dVar7 = dVar7 + (pFVar4->super_LinearExpert<1,_1>).h;
  }
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    if ((this->param).accelerated == false) {
      for (; pFVar5 < pFVar3; pFVar5 = pFVar5 + 1) {
        FastLinearExpert<1,_1>::e_step(pFVar5,z,x,(pFVar5->super_LinearExpert<1,_1>).h / dVar7);
        FastLinearExpert<1,_1>::m_step(pFVar5);
        pFVar3 = (this->experts).
                 super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                 .
                 super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    else {
      for (; pFVar5 < pFVar3; pFVar5 = pFVar5 + 1) {
        dVar6 = (pFVar5->super_LinearExpert<1,_1>).h / dVar7;
        if (0.001 < dVar6) {
          FastLinearExpert<1,_1>::e_step(pFVar5,z,x,dVar6);
          FastLinearExpert<1,_1>::m_step(pFVar5);
          pFVar3 = (this->experts).
                   super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                   .
                   super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
    }
  }
  else {
    FastLinearExpert<1,_1>::FastLinearExpert(&local_1d0,z,x,this);
    std::
    vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>::
    push_back(&(this->experts).
               super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
              ,&local_1d0);
    FastLinearExpert<1,_1>::e_step
              ((this->experts).
               super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               .
               super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,z,x,1.0);
    FastLinearExpert<1,_1>::m_step
              ((this->experts).
               super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               .
               super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1);
    this->M = (int)(((long)(this->experts).
                           super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                           .
                           super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->experts).
                          super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                          .
                          super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x1a8);
    poVar2 = std::operator<<((ostream *)&std::cout,"e_step: sum_h = 0.0! (Should not happen)");
    std::endl<char,std::char_traits<char>>(poVar2);
    pFVar3 = (this->experts).
             super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             .
             super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  local_1d8 = (this->zeroZ).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
              m_data.array[0];
  local_1e0 = (this->zeroX).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
              m_data.array[0];
  for (pFVar5 = (this->experts).
                super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                .
                super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pFVar5 < pFVar3; pFVar5 = pFVar5 + 1) {
    local_1d8 = local_1d8 +
                (pFVar5->super_LinearExpert<1,_1>).invSigma.
                super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
                [0];
    local_1e0 = local_1e0 +
                (pFVar5->super_LinearExpert<1,_1>).invPsi.
                super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
                [0];
  }
  local_1d0.super_LinearExpert<1,_1>.Sx.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>
  .m_storage.m_data.array[0] = (PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)&local_1d8;
  dVar7 = (this->param).wsigma;
  local_1d0.super_LinearExpert<1,_1>.Sz.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>
  .m_storage.m_data.array[0] =
       (PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)(this->param).wSigma;
  local_1d0.super_LinearExpert<1,_1>.invPsi.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
       (PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)
       (((double)this->M *
         (double)local_1d0.super_LinearExpert<1,_1>.Sz.
                 super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
                 [0] - dVar7) * 0.5 + -1.0);
  local_1e8.m_expression = &this->Sigma;
  (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
  [0] = (double)local_1d0.super_LinearExpert<1,_1>.invPsi.
                super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
                [0] *
        (double)local_1d0.super_LinearExpert<1,_1>.invPsi.
                super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
                [0] +
        dVar7 * (double)local_1d0.super_LinearExpert<1,_1>.Sz.
                        super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
                        m_data.array[0] * (this->param).sigma0 * local_1d8;
  local_1d0.super_LinearExpert<1,_1>.Lambda.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
       (PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)
       (PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)local_1e8.m_expression;
  Eigen::internal::
  call_assignment<Eigen::ArrayWrapper<Eigen::Matrix<double,1,1,0,1,1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,1,1,0,1,1>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,1,0,1,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,1,0,1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,1,0,1,1>>const>const>>
            (&local_1e8,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_1,_0,_1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_1,_0,_1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
              *)&local_1d0);
  dVar7 = (this->param).wpsi;
  dVar6 = (this->param).wPsi;
  adVar8[0] = ((double)this->M * dVar6 - dVar7) * 0.5 + -1.0;
  local_1d0.super_LinearExpert<1,_1>.invSigma.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
       (PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)(dVar6 * dVar7);
  local_1d0.super_LinearExpert<1,_1>.Psi.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
       (PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)&(this->param).Psi0;
  pXVar1 = &this->Psi;
  local_1e8.m_expression = pXVar1;
  local_1d0.super_LinearExpert<1,_1>.mixture = (IMLE<1,_1,_LinearExpert> *)&local_1e0;
  Eigen::internal::
  call_assignment<Eigen::ArrayWrapper<Eigen::Matrix<double,1,1,0,1,1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,1,0,1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,1,0,1,1>>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,1,0,1,1>>const>>
            (&local_1e8,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_1,_0,_1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
              *)&local_1d0);
  (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0]
       = adVar8[0] * adVar8[0] +
         (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.
         array[0];
  local_1d0.super_LinearExpert<1,_1>.Sz.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>
  .m_storage.m_data.array[0] =
       (PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)(this->param).wPsi;
  local_1e8.m_expression = pXVar1;
  local_1d0.super_LinearExpert<1,_1>.Lambda.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
       (PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)
       (PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)pXVar1;
  local_1d0.super_LinearExpert<1,_1>.invPsi.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
       (PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)
       (PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)adVar8[0];
  local_1d0.super_LinearExpert<1,_1>.Sx.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>
  .m_storage.m_data.array[0] =
       (PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)
       (PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)&local_1e0;
  Eigen::internal::
  call_assignment<Eigen::ArrayWrapper<Eigen::Matrix<double,1,1,0,1,1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,1,1,0,1,1>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,1,0,1,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,1,0,1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,1,0,1,1>>const>const>>
            (&local_1e8,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_1,_0,_1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_1,_0,_1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
              *)&local_1d0);
  dVar7 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.
          array[0];
  dVar6 = this->sig_level_noiseX_rbf;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  this->pNoiseModelX = dVar6 / dVar7;
  dVar7 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
          m_data.array[0];
  dVar6 = this->sig_level_noiseZ_rbf;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  this->pNoiseModelZ = dVar6 / dVar7;
  dVar6 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.
          array[0] *
          (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
          m_data.array[0];
  dVar7 = this->sig_level_noiseZX_rbf;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  this->pNoiseModelZX = dVar7 / dVar6;
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::EM(Z const &z, X const &x)
{
    // Expectation Step
    Scal h, sum_h = 0.0;
    for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
        sum_h += it->get_h();

    if( sum_h == 0.0)
    {
        // Create new linear expert
#ifdef IMLE_NO_TEMPLATES
        experts.push_back( Expert(d,D,z,x,this) );
#else
        experts.push_back( Expert(z,x,this) );
#endif
        experts.back().e_step(z,x,1.0);
        experts.back().m_step();
        M = experts.size();
        std::cout << "e_step: sum_h = 0.0! (Should not happen)" << std::endl;
    }
    else if( param.accelerated )
        for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
        {
            if( (h = it->get_h()/sum_h) > 0.001 )
            {
                it->e_step( z, x, h );
                it->m_step();
            }

        }
    else
        for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
        {
            it->e_step( z, x, it->get_h()/sum_h );
            it->m_step();
        }

    // Maximization Step
    //
    Z sum_diagSigma = zeroZ;
    X sum_diagPsi = zeroX;
    for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
    {
        sum_diagSigma += it->invSigma.diagonal();
        sum_diagPsi += it->invPsi;
    }

    // Update common inverse-Wishart prior on Sigma
    Scal tmp = (M*param.wSigma - param.wsigma)/2.0 - 1.0;
    Sigma = param.wSigma * param.wsigma * param.sigma0 * sum_diagSigma;
    Sigma.array() += tmp*tmp;
    Sigma.array() = (Sigma.array().sqrt() + tmp) / (param.wSigma * sum_diagSigma.array());

    // Update common inverse-gamma prior on Psi
    tmp = (M*param.wPsi - param.wpsi)/2.0 - 1.0;
    Psi.array() = (param.wPsi * param.wpsi) * param.Psi0.array() * sum_diagPsi.array();
    Psi.array() += tmp*tmp;
    Psi.array() = (Psi.array().sqrt() + tmp) / (param.wPsi * sum_diagPsi.array());

    // Update outlier model
    pNoiseModelX = sig_level_noiseX_rbf / sqrt(Psi.prod());
    pNoiseModelZ = sig_level_noiseZ_rbf / sqrt(Sigma.prod());
    pNoiseModelZX = sig_level_noiseZX_rbf / sqrt(Psi.prod() * Sigma.prod());
}